

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  uint *puVar4;
  uint *puVar5;
  uint local_34;
  
  DVar3 = MCDisassembler_Fail;
  if (0x1000 < (insn & 0x1c00)) {
    return MCDisassembler_Fail;
  }
  uVar2 = insn & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  if ((int)uVar1 < 0x43) {
    if ((int)uVar1 < 0x36) {
      if (uVar1 != 0x31) {
        if (uVar1 != 0x35) {
          return MCDisassembler_Fail;
        }
        goto switchD_00165c0f_caseD_7a2;
      }
switchD_00165c0f_caseD_79e:
      puVar4 = GPR32DecoderTable;
      uVar1 = GPR32DecoderTable[uVar2];
      local_34 = 5;
      puVar5 = puVar4;
      goto LAB_00165cb4;
    }
    if (uVar1 == 0x36) goto switchD_00165c0f_caseD_7a3;
    if (uVar1 != 0x3f) {
      return MCDisassembler_Fail;
    }
switchD_00165c0f_caseD_7a7:
    puVar4 = GPR32DecoderTable;
    local_34 = 5;
    uVar1 = 5;
LAB_00165ca6:
    puVar5 = puVar4;
    if (uVar2 != 0x1f) {
      uVar1 = puVar4[uVar2];
    }
  }
  else {
    switch(uVar1) {
    case 0x79e:
      goto switchD_00165c0f_caseD_79e;
    case 0x79f:
    case 0x7a0:
    case 0x7a1:
    case 0x7a4:
    case 0x7a5:
    case 0x7a6:
    case 0x7a8:
    case 0x7a9:
    case 0x7aa:
      goto switchD_00165c0f_caseD_79f;
    case 0x7a2:
switchD_00165c0f_caseD_7a2:
      puVar4 = GPR64DecoderTable;
      uVar1 = GPR64DecoderTable[uVar2];
      local_34 = 4;
      puVar5 = GPR32DecoderTable;
      break;
    case 0x7a3:
switchD_00165c0f_caseD_7a3:
      puVar4 = GPR64DecoderTable;
      uVar1 = GPR64DecoderTable[uVar2];
      local_34 = 4;
      puVar5 = puVar4;
      break;
    case 0x7a7:
      goto switchD_00165c0f_caseD_7a7;
    case 0x7ac:
switchD_00165c0f_caseD_7ac:
      puVar4 = GPR64DecoderTable;
      local_34 = 4;
      uVar1 = 4;
      goto LAB_00165ca6;
    default:
      if (uVar1 != 0x43) {
        if (uVar1 != 0x44) {
          return MCDisassembler_Fail;
        }
        goto switchD_00165c0f_caseD_7ac;
      }
    case 0x7ab:
      puVar4 = GPR64DecoderTable;
      local_34 = 4;
      uVar1 = 4;
      if (uVar2 != 0x1f) {
        uVar1 = GPR64DecoderTable[uVar2];
      }
      puVar5 = GPR32DecoderTable;
    }
  }
LAB_00165cb4:
  uVar2 = insn >> 5 & 0x1f;
  MCOperand_CreateReg0(Inst,uVar1);
  if (uVar2 != 0x1f) {
    local_34 = puVar4[uVar2];
  }
  MCOperand_CreateReg0(Inst,local_34);
  MCOperand_CreateReg0(Inst,puVar5[insn >> 0x10 & 0x1f]);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 10 & 0x3f));
  DVar3 = MCDisassembler_Success;
switchD_00165c0f_caseD_79f:
  return DVar3;
}

Assistant:

static DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
  unsigned Rd, Rn, Rm;
  unsigned extend = fieldFromInstruction(insn, 10, 6);
  unsigned shift = extend & 0x7;

  if (shift > 4)
    return Fail;

  Rd = fieldFromInstruction(insn, 0, 5);
  Rn = fieldFromInstruction(insn, 5, 5);
  Rm = fieldFromInstruction(insn, 16, 5);

  switch (MCInst_getOpcode(Inst)) {
  default:
    return Fail;
  case AArch64_ADDWrx:
  case AArch64_SUBWrx:
    DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSWrx:
  case AArch64_SUBSWrx:
    DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx:
  case AArch64_SUBXrx:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSXrx:
  case AArch64_SUBSXrx:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx64:
  case AArch64_SUBXrx64:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_SUBSXrx64:
  case AArch64_ADDSXrx64:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  }

  MCOperand_CreateImm0(Inst, extend);
  return Success;
}